

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackOverflowCase::init
          (VertexFeedbackOverflowCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  long lVar8;
  TypedObjectWrapper<(glu::ObjectType)5> *this_02;
  size_type sVar9;
  const_reference pvVar10;
  ShaderProgram *pSVar11;
  undefined7 extraout_var;
  TestError *this_03;
  allocator<char> local_379;
  string local_378;
  MessageBuilder local_358;
  allocator<float> local_1d5;
  value_type_conflict2 local_1d4;
  undefined1 local_1d0 [8];
  vector<float,_std::allocator<float>_> initialBufferContents;
  int feedbackCount;
  Functions *gl;
  deUint32 local_18;
  ContextType local_14;
  VertexFeedbackOverflowCase *local_10;
  VertexFeedbackOverflowCase *this_local;
  undefined4 extraout_var_00;
  
  local_10 = this;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_14,(ApiType)local_18);
  if (!bVar2) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
    if (!bVar2) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x16b4);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<((MessageBuilder *)&gl,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&gl,
                      (char (*) [70])
                      "Testing GL_EXT_geometry_shader transform feedback overflow behavior.\n");
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(char (*) [99])
                             "Capturing vertex shader varying, rendering 2 triangles. Allocating feedback buffer for 5 vertices."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl);
  if (Functional::(anonymous_namespace)::VertexFeedbackOverflowCase::init()::arrayData == '\0') {
    iVar3 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::VertexFeedbackOverflowCase::
                                 init()::arrayData);
    if (iVar3 != 0) {
      tcu::Vector<float,_4>::Vector(init::arrayData,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(init::arrayData + 1,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(init::arrayData + 2,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(init::arrayData + 3,1.0,1.0,1.0,1.0);
      __cxa_guard_release(&Functional::(anonymous_namespace)::VertexFeedbackOverflowCase::init()::
                           arrayData);
    }
  }
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var_00,iVar3);
  this_02 = (TypedObjectWrapper<(glu::ObjectType)5> *)operator_new(0x18);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper(this_02,pRVar5);
  this->m_vao = this_02;
  pcVar1 = *(code **)(lVar8 + 0xd8);
  dVar4 = glu::ObjectWrapper::operator*(&this->m_vao->super_ObjectWrapper);
  (*pcVar1)(dVar4);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"set up vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16d2);
  if (this->m_method == METHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar8 + 0x6c8))(1,&this->m_elementBuf);
    (**(code **)(lVar8 + 0x40))(0x8893,this->m_elementBuf);
    (**(code **)(lVar8 + 0x150))(0x8893,0xc,init::elementData,0x88e4);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"gen buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x16d9);
  }
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_arrayBuf);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_arrayBuf);
  (**(code **)(lVar8 + 0x150))(0x8892,0x40,init::arrayData,0x88e4);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16df);
  initialBufferContents.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x14;
  local_1d4 = -1.0;
  std::allocator<float>::allocator(&local_1d5);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1d0,0x14,&local_1d4,&local_1d5);
  std::allocator<float>::~allocator(&local_1d5);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_358,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_358,(char (*) [48])"Filling feeback buffer with dummy value (-1.0).");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_358);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_feedbackBuf);
  (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_feedbackBuf);
  pcVar1 = *(code **)(lVar8 + 0x150);
  sVar9 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_1d0);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)local_1d0,0);
  (*pcVar1)(0x8c8e,(long)((int)sVar9 << 2),pvVar10,0x88ea);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16ea);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_1d0);
  pSVar11 = genProgram(this);
  this->m_program = pSVar11;
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(pTVar6,this->m_program);
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"could not build program",&local_379);
    tcu::TestError::TestError(this_03,&local_378);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

void VertexFeedbackOverflowCase::init (void)
{
	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// log what test tries to do

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing GL_EXT_geometry_shader transform feedback overflow behavior.\n"
		<< "Capturing vertex shader varying, rendering 2 triangles. Allocating feedback buffer for 5 vertices."
		<< tcu::TestLog::EndMessage;

	// resources

	{
		static const deUint16	elementData[] =
		{
			0, 1, 2,
			0, 1, 2,
		};
		static const tcu::Vec4	arrayData[] =
		{
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		};

		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();

		m_vao = new glu::VertexArray(m_context.getRenderContext());
		gl.bindVertexArray(**m_vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set up vao");

		if (m_method == METHOD_DRAW_ELEMENTS)
		{
			gl.genBuffers(1, &m_elementBuf);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuf);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(elementData), &elementData[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");
		}

		gl.genBuffers(1, &m_arrayBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(arrayData), &arrayData[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");

		{
			const int					feedbackCount			= 5 * 4; // 5x vec4
			const std::vector<float>	initialBufferContents	(feedbackCount, -1.0f);

			m_testCtx.getLog() << tcu::TestLog::Message << "Filling feeback buffer with dummy value (-1.0)." << tcu::TestLog::EndMessage;

			gl.genBuffers(1, &m_feedbackBuf);
			gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_feedbackBuf);
			gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (int)(sizeof(float) * initialBufferContents.size()), &initialBufferContents[0], GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");
		}

		m_program = genProgram();

		if (!m_program->isOk())
		{
			m_testCtx.getLog() << *m_program;
			throw tcu::TestError("could not build program");
		}
	}
}